

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_evaluator.hpp
# Opt level: O3

value_type __thiscall
jsoncons::jsonpath::detail::
avg_function<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::evaluate
          (avg_function<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
           *this,vector<jsoncons::jsonpath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jsonpath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                 *args,error_code *ec)

{
  char *pcVar1;
  bool bVar2;
  uint uVar3;
  iterator this_00;
  size_t sVar4;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *pbVar5;
  error_code *in_RCX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar6;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *this_01;
  double dVar7;
  undefined1 auVar8 [16];
  array_range_type aVar9;
  value_type vVar10;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> arg0;
  double local_38;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> local_30;
  
  pcVar1 = *(char **)ec;
  if (((long)ec->_M_cat - (long)pcVar1 >> 3) * -0x5555555555555555 -
      (long)(args->
            super__Vector_base<jsoncons::jsonpath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jsonpath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish != 0) {
    std::error_code::operator=(in_RCX,invalid_arity);
    pbVar5 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::null();
    basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::uninitialized_copy
              ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,pbVar5);
    uVar6 = extraout_RDX;
    goto LAB_003a51ea;
  }
  if (*pcVar1 == '\0') {
    pbVar5 = *(basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> **)(pcVar1 + 8);
  }
  else {
    pbVar5 = (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)(pcVar1 + 8);
  }
  this_01 = &local_30;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::uninitialized_copy
            (this_01,pbVar5);
  while (uVar3 = *(byte *)&this_01->field_0 & 0xf, uVar3 - 8 < 2) {
    this_01 = *(basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> **)
               ((long)&this_01->field_0 + 8);
  }
  if (uVar3 == 0xe) {
    bVar2 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::empty(&local_30);
    if (bVar2) goto LAB_003a51d0;
    aVar9 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::array_range(&local_30)
    ;
    this_00 = aVar9.first_._M_current;
    if (this_00._M_current == aVar9.last_._M_current._M_current) {
      local_38 = 0.0;
    }
    else {
      local_38 = 0.0;
      do {
        bVar2 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_number
                          (this_00._M_current);
        if (!bVar2) {
          std::error_code::operator=(in_RCX,invalid_type);
          pbVar5 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::null();
          basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::uninitialized_copy
                    ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,pbVar5
                    );
          goto LAB_003a51e0;
        }
        dVar7 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::as_double
                          (this_00._M_current);
        local_38 = local_38 + dVar7;
        this_00._M_current = this_00._M_current + 1;
      } while (this_00._M_current != aVar9.last_._M_current._M_current);
    }
    sVar4 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size(&local_30);
    auVar8._8_4_ = (int)(sVar4 >> 0x20);
    auVar8._0_8_ = sVar4;
    auVar8._12_4_ = 0x45300000;
    *(undefined2 *)
     &(this->
      super_function_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
      )._vptr_function_base = 5;
    (this->
    super_function_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
    ).arg_count_.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_payload =
         (_Storage<unsigned_long,_true>)
         (local_38 /
         ((auVar8._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)sVar4) - 4503599627370496.0)));
  }
  else {
    std::error_code::operator=(in_RCX,invalid_type);
LAB_003a51d0:
    pbVar5 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::null();
    basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::uninitialized_copy
              ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,pbVar5);
  }
LAB_003a51e0:
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::destroy(&local_30);
  uVar6 = extraout_RDX_00;
LAB_003a51ea:
  vVar10.field_0.int64_.val_ = uVar6;
  vVar10.field_0._0_8_ = this;
  return (value_type)vVar10.field_0;
}

Assistant:

value_type evaluate(const std::vector<parameter_type>& args, 
            std::error_code& ec) const override
        {
            if (args.size() != *this->arity())
            {
                ec = jsonpath_errc::invalid_arity;
                return value_type::null();
            }

            auto arg0= args[0].value();
            if (!arg0.is_array())
            {
                ec = jsonpath_errc::invalid_type;
                return value_type::null();
            }
            if (arg0.empty())
            {
                return value_type::null();
            }
            double sum = 0;
            for (auto& j : arg0.array_range())
            {
                if (!j.is_number())
                {
                    ec = jsonpath_errc::invalid_type;
                    return value_type::null();
                }
                sum += j.template as<double>();
            }

            return value_type(sum / static_cast<double>(arg0.size()), semantic_tag::none);
        }